

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.h
# Opt level: O0

EmitInfo __thiscall
JsUtil::Stack<Wasm::EmitInfo,_Memory::ArenaAllocator,_false,_DefaultComparer>::Pop
          (Stack<Wasm::EmitInfo,_Memory::ArenaAllocator,_false,_DefaultComparer> *this)

{
  int iVar1;
  Type *pTVar2;
  EmitInfo EVar3;
  Stack<Wasm::EmitInfo,_Memory::ArenaAllocator,_false,_DefaultComparer> *this_local;
  EmitInfo item;
  
  iVar1 = ReadOnlyList<Wasm::EmitInfo,_Memory::ArenaAllocator,_DefaultComparer>::Count
                    ((ReadOnlyList<Wasm::EmitInfo,_Memory::ArenaAllocator,_DefaultComparer> *)this);
  pTVar2 = List<Wasm::EmitInfo,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
           ::Item(&this->list,iVar1 + -1);
  iVar1 = ReadOnlyList<Wasm::EmitInfo,_Memory::ArenaAllocator,_DefaultComparer>::Count
                    ((ReadOnlyList<Wasm::EmitInfo,_Memory::ArenaAllocator,_DefaultComparer> *)this);
  List<Wasm::EmitInfo,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
  RemoveAt(&this->list,iVar1 + -1);
  EVar3.super_EmitInfoBase.location = (pTVar2->super_EmitInfoBase).location;
  EVar3.type = pTVar2->type;
  return EVar3;
}

Assistant:

T Pop()
        {
            T item = list.Item(list.Count() - 1);
            list.RemoveAt(list.Count() - 1);
            return item;
        }